

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  size_t _elemsize;
  size_t sVar2;
  int *piVar3;
  pointer pMVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  uint uVar17;
  void *pvVar18;
  float *pfVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  undefined4 *puVar27;
  ulong uVar28;
  uint _w;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  float fVar33;
  ulong local_100;
  ulong local_f8;
  Mat local_e8;
  Mat local_98;
  Gemm *local_50;
  void *local_48;
  long local_40;
  ulong local_38;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  _elemsize = pMVar1->elemsize;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  local_50 = this;
  if (this->transA == 0) {
    if (&local_e8 != pMVar1) {
      piVar3 = pMVar1->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_e8.data = pMVar1->data;
      local_e8.refcount._0_4_ = SUB84(pMVar1->refcount,0);
      local_e8.refcount._4_4_ = (undefined4)((ulong)pMVar1->refcount >> 0x20);
      local_e8.elemsize._0_4_ = (undefined4)pMVar1->elemsize;
      local_e8.elemsize._4_4_ = (undefined4)(pMVar1->elemsize >> 0x20);
      local_e8.elempack = pMVar1->elempack;
      local_e8.allocator = pMVar1->allocator;
      uVar5 = pMVar1->dims;
      uVar6 = pMVar1->w;
      uVar7 = pMVar1->h;
      uVar8 = pMVar1->d;
      local_e8.c = pMVar1->c;
      local_e8.cstep = pMVar1->cstep;
      local_e8.dims = uVar5;
      local_e8.w = uVar6;
      local_e8.h = uVar7;
      local_e8.d = uVar8;
    }
  }
  else {
    Mat::create(&local_e8,pMVar1->h,pMVar1->w,_elemsize,opt->workspace_allocator);
    if (0 < (long)local_e8.h) {
      lVar22 = 0;
      lVar24 = 0;
      pvVar16 = local_e8.data;
      do {
        if (0 < local_e8.w) {
          iVar14 = pMVar1->w;
          sVar2 = pMVar1->elemsize;
          puVar27 = (undefined4 *)((long)pMVar1->data + lVar22);
          uVar29 = 0;
          do {
            *(undefined4 *)((long)pvVar16 + uVar29 * 4) = *puVar27;
            uVar29 = uVar29 + 1;
            puVar27 = (undefined4 *)((long)puVar27 + (long)iVar14 * sVar2);
          } while ((uint)local_e8.w != uVar29);
        }
        lVar24 = lVar24 + 1;
        pvVar16 = (void *)((long)pvVar16 +
                          (long)local_e8.w *
                          CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
        lVar22 = lVar22 + 4;
      } while (lVar24 != local_e8.h);
    }
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  if (local_50->transB == 0) {
    Mat::create(&local_98,pMVar1[1].h,pMVar1[1].w,_elemsize,opt->workspace_allocator);
    local_100 = (ulong)local_98.h;
    if (0 < (long)local_100) {
      lVar22 = 0;
      uVar29 = 0;
      pvVar16 = local_98.data;
      do {
        if (0 < local_98.w) {
          iVar14 = pMVar1[1].w;
          sVar2 = pMVar1[1].elemsize;
          puVar27 = (undefined4 *)((long)pMVar1[1].data + lVar22);
          uVar28 = 0;
          do {
            *(undefined4 *)((long)pvVar16 + uVar28 * 4) = *puVar27;
            uVar28 = uVar28 + 1;
            puVar27 = (undefined4 *)((long)puVar27 + (long)iVar14 * sVar2);
          } while ((uint)local_98.w != uVar28);
        }
        uVar29 = uVar29 + 1;
        pvVar16 = (void *)((long)pvVar16 +
                          (long)local_98.w *
                          CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
        lVar22 = lVar22 + 4;
      } while (uVar29 != local_100);
    }
  }
  else if (&local_98 == pMVar1 + 1) {
    local_100 = 0;
  }
  else {
    piVar3 = pMVar1[1].refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_98.data = pMVar1[1].data;
    local_98.refcount._0_4_ = SUB84(pMVar1[1].refcount,0);
    local_98.refcount._4_4_ = (undefined4)((ulong)pMVar1[1].refcount >> 0x20);
    local_98.elemsize._0_4_ = (undefined4)pMVar1[1].elemsize;
    local_98.elemsize._4_4_ = (undefined4)(pMVar1[1].elemsize >> 0x20);
    local_98.elempack = pMVar1[1].elempack;
    local_98.allocator = pMVar1[1].allocator;
    uVar9 = pMVar1[1].dims;
    uVar10 = pMVar1[1].w;
    uVar11 = pMVar1[1].h;
    uVar12 = pMVar1[1].d;
    local_100 = (ulong)(uint)pMVar1[1].h;
    local_98.c = pMVar1[1].c;
    local_98.cstep = pMVar1[1].cstep;
    local_98.dims = uVar9;
    local_98.w = uVar10;
    local_98.h = uVar11;
    local_98.d = uVar12;
  }
  iVar13 = local_e8.h;
  iVar14 = local_e8.w;
  uVar29 = (ulong)(uint)local_e8.h;
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar22 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4;
  _w = (uint)local_100;
  if (lVar22 == 0xd8) {
    iVar15 = pMVar4[2].dims;
    uVar21 = pMVar4[2].w;
    bVar31 = uVar21 == _w;
    uVar17 = (uint)(uVar21 == local_e8.h && iVar15 == 1);
    uVar23 = uVar17;
    if (bVar31) {
      uVar23 = 4;
    }
    if (iVar15 != 1) {
      uVar23 = uVar17;
    }
    uVar17 = pMVar4[2].h;
    uVar25 = 2;
    if (uVar17 != local_e8.h) {
      uVar25 = uVar23;
    }
    if (uVar21 != 1) {
      uVar25 = uVar23;
    }
    bVar32 = iVar15 != 2;
    if (bVar32) {
      uVar25 = uVar23;
    }
    uVar21 = 3;
    if (uVar17 != local_e8.h) {
      uVar21 = uVar25;
    }
    if (bVar32 || !bVar31) {
      uVar21 = uVar25;
    }
    uVar23 = 4;
    if (uVar17 != 1) {
      uVar23 = uVar21;
    }
    if (bVar32 || !bVar31) {
      uVar23 = uVar21;
    }
    local_f8 = (ulong)uVar23;
  }
  else {
    local_f8 = 0;
  }
  uVar28 = (ulong)(uint)local_e8.w;
  pMVar1 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar1,_w,local_e8.h,_elemsize,opt->blob_allocator);
  pfVar19 = (float *)pMVar1->data;
  iVar15 = -100;
  if ((pfVar19 != (float *)0x0) && ((long)pMVar1->c * pMVar1->cstep != 0)) {
    if (0 < iVar13) {
      local_48 = local_98.data;
      lVar24 = (long)local_98.w * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
      local_40 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      uVar26 = 0;
      pvVar16 = local_e8.data;
      do {
        local_38 = uVar29;
        if (0 < (int)_w) {
          uVar20 = 0;
          pvVar18 = local_98.data;
          do {
            fVar33 = 0.0;
            if (lVar22 == 0xd8) {
              iVar14 = (*(code *)(&DAT_00522170 + *(int *)(&DAT_00522170 + local_f8 * 4)))
                                 (lVar24,&DAT_00522170 + *(int *)(&DAT_00522170 + local_f8 * 4));
              return iVar14;
            }
            if (0 < iVar14) {
              uVar30 = 0;
              do {
                fVar33 = fVar33 + *(float *)((long)pvVar18 + uVar30 * 4) *
                                  *(float *)((long)pvVar16 + uVar30 * 4);
                uVar30 = uVar30 + 1;
              } while (uVar28 != uVar30);
            }
            *pfVar19 = fVar33 * local_50->alpha;
            pfVar19 = pfVar19 + 1;
            uVar20 = uVar20 + 1;
            pvVar18 = (void *)((long)pvVar18 + lVar24);
          } while (uVar20 != (local_100 & 0xffffffff));
        }
        uVar26 = uVar26 + 1;
        pvVar16 = (void *)((long)pvVar16 + local_40);
      } while (uVar26 != uVar29);
    }
    iVar15 = 0;
  }
  piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = bottom_blobs[0];
    const Mat& B0 = bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create(A0.h, A0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0.row(j)[i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create(B0.h, B0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0.row(j)[i];
            }
        }
    }
    else
    {
        B = B0;
    }

    int M = A.h;
    int K = A.w; // assert A.w == B.w
    int N = B.h;

    bool has_C = bottom_blobs.size() == 3;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (has_C)
    {
        const Mat& C = bottom_blobs[2];

        ptrC = C;

        if (C.dims == 1 && C.w == 1)
        {
            // scalar
            broadcast_type_C = 0;
        }
        if (C.dims == 1 && C.w == M)
        {
            // M
            // auto broadcast from h to w is the ncnn-style convention
            broadcast_type_C = 1;
        }
        if (C.dims == 1 && C.w == N)
        {
            // N
            broadcast_type_C = 4;
        }
        if (C.dims == 2 && C.w == 1 && C.h == M)
        {
            // Mx1
            broadcast_type_C = 2;
        }
        if (C.dims == 2 && C.w == N && C.h == M)
        {
            // MxN
            broadcast_type_C = 3;
        }
        if (C.dims == 2 && C.w == N && C.h == 1)
        {
            // 1xN
            broadcast_type_C = 4;
        }
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(N, M, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* outptr = top_blob;
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = A.row(i);

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = B.row(j);

            float sum = 0.f;
            if (has_C)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum * alpha;
        }
    }

    return 0;
}